

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O3

void mp::WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
               (CStringRef filename,SolutionAdapter<StrictMockProblemBuilder> *sol)

{
  uint uVar1;
  uint uVar2;
  BasicSuffixSet<std::allocator<char>_> *suffixes;
  ulong uVar3;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ArgList args;
  ArgList args_00;
  ArgList args_01;
  ArgList args_02;
  ArgList args_03;
  ArgList args_04;
  ArgList args_05;
  BufferedFile file;
  BufferedFile local_88;
  ulong local_80;
  double local_78 [2];
  ulong local_68;
  ulong local_58;
  ulong local_48;
  
  fmt::BufferedFile::BufferedFile(&local_88,filename,(CStringRef)0x21a5a2);
  internal::WriteMessage(&local_88,sol->message_);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  args.field_1.values_ = in_R8.values_;
  args.types_ = (uint64_t)local_78;
  fmt::print((fmt *)local_88.file_,(FILE *)"Options\n",(CStringRef)0x0,args);
  uVar4 = (sol->options_).size_;
  uVar1 = (uint)uVar4;
  if (uVar1 != 0) {
    local_78[0] = (double)(uVar4 & 0xffffffff);
    args_00.field_1.values_ = in_R8.values_;
    args_00.types_ = (uint64_t)local_78;
    fmt::print((fmt *)local_88.file_,(FILE *)0x229bdd,(CStringRef)0x2,args_00);
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        local_78[0] = (double)(sol->options_).data_[uVar4];
        args_01.field_1.values_ = in_R8.values_;
        args_01.types_ = (uint64_t)local_78;
        fmt::print((fmt *)local_88.file_,(FILE *)0x229bdd,(CStringRef)0x4,args_01);
        uVar4 = uVar4 + 1;
      } while ((uVar1 & 0x7fffffff) != uVar4);
    }
  }
  uVar4 = (sol->values_).size_;
  uVar3 = (sol->dual_values_).size_;
  uVar1 = MockProblemBuilder::num_vars
                    (&(sol->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder
                    );
  uVar2 = MockProblemBuilder::num_algebraic_cons
                    (&(sol->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder
                    );
  local_48 = uVar4 & 0xffffffff;
  uVar5 = (uint)uVar3;
  local_68 = uVar3 & 0xffffffff;
  local_78[0] = (double)(ulong)uVar2;
  local_58 = (ulong)uVar1;
  args_02.field_1.values_ = in_R8.values_;
  args_02.types_ = (uint64_t)local_78;
  fmt::print((fmt *)local_88.file_,(FILE *)"{0}\n{1}\n{2}\n{3}\n",(CStringRef)0x2222,args_02);
  local_80 = uVar4;
  if (0 < (int)uVar5) {
    uVar3 = 0;
    do {
      local_78[0] = (sol->dual_values_).data_[uVar3];
      args_03.field_1.values_ = in_R8.values_;
      args_03.types_ = (uint64_t)local_78;
      fmt::print((fmt *)local_88.file_,(FILE *)0x21a5e9,(CStringRef)0x8,args_03);
      uVar3 = uVar3 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  if (0 < (int)local_80) {
    uVar3 = 0;
    do {
      local_78[0] = (sol->values_).data_[uVar3];
      args_04.field_1.values_ = in_R8.values_;
      args_04.types_ = (uint64_t)local_78;
      fmt::print((fmt *)local_88.file_,(FILE *)0x21a5e9,(CStringRef)0x8,args_04);
      uVar3 = uVar3 + 1;
    } while (((uint)uVar4 & 0x7fffffff) != uVar3);
  }
  local_68 = (ulong)(uint)sol->status_;
  local_78[0] = (double)(ulong)(sol->objno_ - 1);
  args_05.field_1.values_ = in_R8.values_;
  args_05.types_ = (uint64_t)local_78;
  fmt::print((fmt *)local_88.file_,(FILE *)"objno {} {}\n",(CStringRef)0x22,args_05);
  lVar6 = 0;
  do {
    if (sol->builder_ == (StrictMockProblemBuilder *)0x0) {
      suffixes = (BasicSuffixSet<std::allocator<char>_> *)0x0;
    }
    else {
      suffixes = MockProblemBuilder::suffixes
                           (&(sol->builder_->super_StrictMock<MockProblemBuilder>).
                             super_MockProblemBuilder,*(Argument1 *)((long)&DAT_00215060 + lVar6));
    }
    internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>(&local_88,suffixes);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  fmt::BufferedFile::~BufferedFile(&local_88);
  return;
}

Assistant:

void WriteSolFile(fmt::CStringRef filename, const Solution &sol) {
  fmt::BufferedFile file(filename, "wb");
  internal::WriteMessage(file, sol.message());
  // Write options.
  file.print("Options\n");
  if (int num_options = sol.num_options()) {
    file.print("{}\n", num_options);
    for (int i = 0; i < num_options; ++i)
      file.print("{}\n", sol.option(i));
  }
  int num_values = sol.num_values(), num_dual_values = sol.num_dual_values(),
    num_vars = sol.num_vars(), num_constraints = sol.num_algebraic_cons();
  file.print("{0}\n{1}\n{2}\n{3}\n",
    num_constraints, num_dual_values, num_vars, num_values);
  for (int i = 0, n = num_dual_values; i < n; ++i)
    file.print("{:.16}\n", sol.dual_value(i));
  for (int i = 0; i < num_values; ++i)
    file.print("{:.16}\n", sol.value(i));
  file.print("objno {} {}\n", sol.objno()-1, sol.status());
  suf::Kind kinds[] = {suf::VAR, suf::CON, suf::OBJ, suf::PROBLEM};
  for (std::size_t i = 0, n = sizeof(kinds) / sizeof(*kinds); i < n; ++i)
    internal::WriteSuffixes(file, sol.suffixes(kinds[i]));
}